

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::_InternalSerialize
          (TensorValue_RepeatedBools *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  uint uVar1;
  uint8_t *puVar2;
  LogMessage *other;
  ulong uVar3;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (0 < (this->values_).current_size_) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    size = (this->values_).current_size_;
    if (stream->end_ <= puVar2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    *puVar2 = '\n';
    puVar2 = puVar2 + 2;
    for (uVar1 = size; 0x7f < uVar1; uVar1 = uVar1 >> 7) {
      puVar2[-1] = (byte)uVar1 | 0x80;
      puVar2 = puVar2 + 1;
    }
    puVar2[-1] = (byte)uVar1;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,(this->values_).arena_or_elements_,size,puVar2);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffc;
    target = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                       (stream,*(void **)(uVar3 + 8),*(int *)(uVar3 + 0x10),target);
  }
  return target;
}

Assistant:

uint8_t* TensorValue_RepeatedBools::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue.RepeatedBools)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated bool values = 1 [packed = true];
  if (this->_internal_values_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_values(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue.RepeatedBools)
  return target;
}